

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export>::setCapacity
          (Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export> *this,size_t newSize)

{
  Export *pEVar1;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Export> *pRVar2;
  Export *pEVar3;
  ulong uVar4;
  __off_t in_RDX;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export> newBuilder;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export> local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * 0x6db6db6db6db6db7;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Export *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_38.pos = local_38.ptr;
  local_38.pos = kj::_::
                 CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
                 ::apply(local_38.ptr,(this->builder).ptr,(this->builder).pos);
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Export>::operator=
            (&this->builder,&local_38);
  pEVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar1 = local_38.ptr;
  if (local_38.ptr != (Export *)0x0) {
    local_38.ptr = (Export *)0x0;
    local_38.pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Export> *)0x0;
    local_38.endPtr = (Export *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar1,0x38,((long)pRVar2 - (long)pEVar1 >> 3) * 0x6db6db6db6db6db7
               ,((long)pEVar3 - (long)pEVar1 >> 3) * 0x6db6db6db6db6db7,
               ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Export>::
               destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }